

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

RecyclerWeakReference<const_Js::PropertyRecord> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
::UncheckedInsert(WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
                  *this,RecyclerWeakReference<const_Js::PropertyRecord> *weakRef,
                 PropertyGuardEntry *value)

{
  hash_t key;
  hash_t key_00;
  Type pcVar1;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  *pWVar2;
  Type pcVar3;
  code *pcVar4;
  bool bVar5;
  hash_t bucket;
  hash_t bucket_00;
  uint uVar6;
  undefined4 *puVar7;
  RecyclerWeakReference<const_Js::PropertyRecord> *pRVar8;
  uint i;
  uint previous;
  
  if ((this->buckets).ptr == (int *)0x0) {
    Initialize(this,0);
  }
  key = *(int *)((weakRef->super_RecyclerWeakReferenceBase).strongRef + 0xc) * 2 + 1;
  bucket = PrimePolicy::ModPrime(key,this->size,this->modFunctionIndex);
  if ((this->buckets).ptr != (int *)0x0) {
    pcVar1 = (weakRef->super_RecyclerWeakReferenceBase).strongRef;
    key_00 = *(int *)(pcVar1 + 0xc) * 2 + 1;
    bucket_00 = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
    if ((this->buckets).ptr != (int *)0x0) {
      Memory::Recycler::IsSweeping(this->recycler);
      i = (this->buckets).ptr[bucket_00];
      if (-1 < (int)i) {
        previous = 0xffffffff;
        do {
          pWVar2 = (this->entries).ptr;
          if (pWVar2[i].hash == key_00) {
            pcVar3 = ((pWVar2[i].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
            if (pcVar3 != (Type)0x0) {
              if (*(int *)(pcVar3 + 8) != *(int *)(pcVar1 + 8)) goto LAB_007c1d62;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
                                 ,0x10a,"(FindEntry(weakRef->FastGet()) == -1)",
                                 "FindEntry(weakRef->FastGet()) == -1");
              if (!bVar5) {
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar7 = 0;
              break;
            }
            uVar6 = RemoveEntry(this,i,previous,bucket_00);
          }
          else {
LAB_007c1d62:
            uVar6 = pWVar2[i].next;
            previous = i;
          }
          i = uVar6;
        } while (-1 < (int)i);
      }
    }
  }
  pRVar8 = Insert(this,weakRef,value,key,bucket);
  return pRVar8;
}

Assistant:

const RecyclerWeakReference<TKey>* UncheckedInsert(const RecyclerWeakReference<TKey>* weakRef, TValue value)
        {
            if (buckets == nullptr) Initialize(0);

            int hash = GetHashCode(weakRef->FastGet());
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            Assert(FindEntry(weakRef->FastGet()) == -1);
            return Insert(weakRef, value, hash, bucket);
        }